

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

unsigned_long __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_long>,unsigned_long>
          (STObject *this,SField *field)

{
  int iVar1;
  STBase *pSVar2;
  STInteger<unsigned_long> *local_48;
  STInteger<unsigned_long> *cf;
  SerializedTypeID id;
  STBase *rf;
  SField *field_local;
  STObject *this_local;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])();
  if (iVar1 == 0) {
    this_local = (STObject *)0x0;
  }
  else {
    if (pSVar2 == (STBase *)0x0) {
      local_48 = (STInteger<unsigned_long> *)0x0;
    }
    else {
      local_48 = (STInteger<unsigned_long> *)
                 __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_long>::typeinfo,0);
    }
    if (local_48 == (STInteger<unsigned_long> *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    this_local = (STObject *)STInteger<unsigned_long>::value(local_48);
  }
  return (unsigned_long)this_local;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }